

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.hpp
# Opt level: O1

void __thiscall
boost::xpressive::detail::
match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::init_(match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,regex_impl *impl,match_results *what)

{
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *regex_id;
  size_t sVar1;
  size_t sVar2;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  
  regex_id = (impl->xpr_).px;
  sVar2 = impl->mark_count_ + 1;
  sVar1 = impl->hidden_mark_count_;
  (this->context_).results_ptr_ = what;
  (this->context_).traits_ = (impl->traits_).px;
  this->mark_count_ = sVar2;
  psVar3 = sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::push_sequence(&this->extras_->sub_match_stack_,sVar1 + sVar2);
  this->sub_matches_ = psVar3;
  sVar1 = impl->hidden_mark_count_;
  this->sub_matches_ = psVar3 + sVar1;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::init_(what,regex_id,&impl->traits_,psVar3 + sVar1,this->mark_count_,&impl->named_marks_);
  return;
}

Assistant:

void init_(regex_impl const &impl, match_results &what)
    {
        regex_id_type const id = impl.xpr_.get();
        std::size_t const total_mark_count = impl.mark_count_ + impl.hidden_mark_count_ + 1;

        // initialize the context and the sub_match vector
        this->context_.results_ptr_ = &what;
        this->context_.traits_ = impl.traits_.get();
        this->mark_count_ = impl.mark_count_ + 1;
        this->sub_matches_ = this->extras_->sub_match_stack_.push_sequence(total_mark_count, sub_match_impl(begin_), detail::fill);
        this->sub_matches_ += impl.hidden_mark_count_;

        // initialize the match_results struct
        access::init_match_results(what, id, impl.traits_, this->sub_matches_, this->mark_count_, impl.named_marks_);
    }